

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QString * maybeEncodeTag(QString *__return_storage_ptr__,QCborContainerPrivate *d)

{
  Element *pEVar1;
  QCborTag encoding;
  ulong uVar2;
  storage_type *extraout_RDX;
  char *pcVar3;
  ByteData *this;
  long in_FS_OFFSET;
  QByteArrayView bytes;
  QArrayDataPointer<char> local_40;
  QUuid local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar1 = (d->elements).d.ptr;
  encoding = (pEVar1->field_0).value;
  if (encoding - 0x15 < 3) {
    if (pEVar1[1].type == ByteArray) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        encodeByteArray(__return_storage_ptr__,d,1,encoding);
        return __return_storage_ptr__;
      }
      goto LAB_002c1c5f;
    }
  }
  else if (encoding == 0) {
LAB_002c1b1c:
    if (pEVar1[1].type == String) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        makeString(__return_storage_ptr__,d,1,FromRaw);
        return __return_storage_ptr__;
      }
      goto LAB_002c1c5f;
    }
  }
  else if (encoding == 0x25) {
    uVar2._0_4_ = pEVar1[1].type;
    uVar2._4_4_ = pEVar1[1].flags;
    pcVar3 = (d->data).d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = &QByteArray::_empty;
    }
    if (((uVar2 & 0x2ffffffff) == 0x200000040) &&
       (this = (ByteData *)
               ((ulong)(pcVar3 + pEVar1[1].field_0.value) & (long)(uVar2 << 0x1e) >> 0x3f),
       this->len == 0x10)) {
      QtCbor::ByteData::asByteArrayView((QByteArray *)&local_40,this);
      bytes.m_data = extraout_RDX;
      bytes.m_size = (qsizetype)local_40.ptr;
      local_28 = QUuid::fromRfc4122((QUuid *)local_40.size,bytes);
      QUuid::toString(__return_storage_ptr__,&local_28,WithoutBraces);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return __return_storage_ptr__;
      }
      goto LAB_002c1c5f;
    }
  }
  else if (encoding == 0x20) goto LAB_002c1b1c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_002c1c5f:
  __stack_chk_fail();
}

Assistant:

static QString maybeEncodeTag(const QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    const Element &e = d->elements.at(1);

    switch (tag) {
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String)
            return makeString(d, 1);
        break;

    case qint64(QCborKnownTags::ExpectedBase64url):
    case qint64(QCborKnownTags::ExpectedBase64):
    case qint64(QCborKnownTags::ExpectedBase16):
        if (e.type == QCborValue::ByteArray)
            return encodeByteArray(d, 1, QCborTag(tag));
        break;

    case qint64(QCborKnownTags::Uuid):
#ifndef QT_BOOTSTRAPPED
        if (const ByteData *b = d->byteData(e); e.type == QCborValue::ByteArray && b
                && b->len == sizeof(QUuid))
            return QUuid::fromRfc4122(b->asByteArrayView()).toString(QUuid::WithoutBraces);
#endif
        break;
    }

    // don't know what to do, bail out
    return QString();
}